

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5StructurePromote(Fts5Index *p,int iLvl,Fts5Structure *pStruct)

{
  int *piVar1;
  u64 *puVar2;
  undefined8 *puVar3;
  uint uVar4;
  Fts5StructureSegment *pFVar5;
  Fts5StructureSegment *pFVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  u64 uVar9;
  u64 uVar10;
  u64 uVar11;
  int bInsert;
  long lVar12;
  int iVar13;
  long lVar14;
  Fts5StructureSegment **ppFVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  long local_48;
  
  if (p->rc != 0) {
    return;
  }
  lVar14 = (long)pStruct->aLevel[iLvl].nSeg;
  if (lVar14 != 0) {
    pFVar5 = pStruct->aLevel[iLvl].aSeg;
    bInsert = (pFVar5[lVar14 + -1].pgnoLast - pFVar5[lVar14 + -1].pgnoFirst) + 1;
    ppFVar15 = &pStruct->aLevel[(uint)iLvl].aSeg;
    iVar13 = iLvl;
    do {
      if (iVar13 < 1) {
        iVar16 = 0;
        iVar13 = -1;
        goto LAB_001cb434;
      }
      uVar4 = *(uint *)((long)ppFVar15 + -0x14);
      iVar13 = iVar13 + -1;
      ppFVar15 = ppFVar15 + -2;
    } while (uVar4 == 0);
    uVar17 = 0;
    uVar18 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar18 = uVar17;
    }
    iVar16 = 0;
    for (; uVar18 * 0x38 - uVar17 != 0; uVar17 = uVar17 + 0x38) {
      iVar19 = *(int *)((long)&(*ppFVar15)->pgnoLast + uVar17) -
               *(int *)((long)&(*ppFVar15)->pgnoFirst + uVar17);
      if (iVar16 <= iVar19) {
        iVar16 = iVar19 + 1;
      }
    }
    if (iVar16 < bInsert) {
      iVar13 = -1;
      iVar16 = 0;
    }
LAB_001cb434:
    if (-1 < iVar13) {
      iLvl = iVar13;
      bInsert = iVar16;
    }
    lVar12 = (long)iLvl;
    lVar14 = lVar12;
    if (pStruct->aLevel[lVar12].nMerge == 0) {
      while ((local_48 = lVar14, local_48 + 1 < (long)pStruct->nLevel &&
             (pStruct[1].aLevel[local_48 + -2].nMerge == 0))) {
        uVar18 = (ulong)(uint)pStruct[1].aLevel[local_48 + -2].nSeg;
        lVar20 = uVar18 * 0x38;
        for (; lVar14 = local_48 + 1, 0 < (int)uVar18; uVar18 = (ulong)((int)uVar18 - 1)) {
          pFVar5 = pStruct[1].aLevel[local_48 + -2].aSeg;
          if (bInsert < (*(int *)((long)pFVar5 + lVar20 + -0x30) -
                        *(int *)((long)pFVar5 + lVar20 + -0x34)) + 1) {
            return;
          }
          fts5StructureExtendLevel(&p->rc,pStruct,iLvl,1,bInsert);
          if (p->rc != 0) {
            return;
          }
          pFVar5 = pStruct->aLevel[lVar12].aSeg;
          pFVar6 = pStruct[1].aLevel[local_48 + -2].aSeg;
          pFVar5->nEntry = *(u64 *)(lVar20 + -8 + (long)pFVar6);
          puVar3 = (undefined8 *)((long)&pFVar6[-1].iSegid + lVar20);
          uVar7 = *puVar3;
          uVar8 = puVar3[1];
          puVar2 = (u64 *)(lVar20 + -0x28 + (long)pFVar6);
          uVar9 = *puVar2;
          uVar10 = puVar2[1];
          puVar3 = (undefined8 *)(lVar20 + -0x18 + (long)pFVar6);
          uVar11 = puVar3[1];
          *(undefined8 *)&pFVar5->nPgTombstone = *puVar3;
          pFVar5->nEntryTombstone = uVar11;
          pFVar5->iOrigin1 = uVar9;
          pFVar5->iOrigin2 = uVar10;
          pFVar5->iSegid = (int)uVar7;
          pFVar5->pgnoFirst = (int)((ulong)uVar7 >> 0x20);
          *(undefined8 *)&pFVar5->pgnoLast = uVar8;
          piVar1 = &pStruct->aLevel[lVar12].nSeg;
          *piVar1 = *piVar1 + 1;
          piVar1 = &pStruct[1].aLevel[local_48 + -2].nSeg;
          *piVar1 = *piVar1 + -1;
          lVar20 = lVar20 + -0x38;
        }
      }
    }
  }
  return;
}

Assistant:

static void fts5StructurePromote(
  Fts5Index *p,                   /* FTS5 backend object */
  int iLvl,                       /* Index level just updated */
  Fts5Structure *pStruct          /* Index structure */
){
  if( p->rc==SQLITE_OK ){
    int iTst;
    int iPromote = -1;
    int szPromote = 0;            /* Promote anything this size or smaller */
    Fts5StructureSegment *pSeg;   /* Segment just written */
    int szSeg;                    /* Size of segment just written */
    int nSeg = pStruct->aLevel[iLvl].nSeg;

    if( nSeg==0 ) return;
    pSeg = &pStruct->aLevel[iLvl].aSeg[pStruct->aLevel[iLvl].nSeg-1];
    szSeg = (1 + pSeg->pgnoLast - pSeg->pgnoFirst);

    /* Check for condition (a) */
    for(iTst=iLvl-1; iTst>=0 && pStruct->aLevel[iTst].nSeg==0; iTst--);
    if( iTst>=0 ){
      int i;
      int szMax = 0;
      Fts5StructureLevel *pTst = &pStruct->aLevel[iTst];
      assert( pTst->nMerge==0 );
      for(i=0; i<pTst->nSeg; i++){
        int sz = pTst->aSeg[i].pgnoLast - pTst->aSeg[i].pgnoFirst + 1;
        if( sz>szMax ) szMax = sz;
      }
      if( szMax>=szSeg ){
        /* Condition (a) is true. Promote the newest segment on level
        ** iLvl to level iTst.  */
        iPromote = iTst;
        szPromote = szMax;
      }
    }

    /* If condition (a) is not met, assume (b) is true. StructurePromoteTo()
    ** is a no-op if it is not.  */
    if( iPromote<0 ){
      iPromote = iLvl;
      szPromote = szSeg;
    }
    fts5StructurePromoteTo(p, iPromote, szPromote, pStruct);
  }
}